

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Track::GetFirst(Track *this,BlockEntry **pBlockEntry)

{
  bool bVar1;
  int iVar2;
  Cluster *this_00;
  long lVar3;
  undefined4 extraout_var;
  int iVar4;
  BlockEntry *pBVar5;
  BlockEntry *pNextEntry;
  BlockEntry *local_30;
  
  this_00 = Segment::GetFirst(this->m_pSegment);
  iVar4 = 0;
  do {
    if (this_00->m_pSegment == (Segment *)0x0) {
      bVar1 = Segment::DoneParsing(this->m_pSegment);
      if (!bVar1) {
        *pBlockEntry = (BlockEntry *)0x0;
        return -3;
      }
      break;
    }
    lVar3 = Cluster::GetFirst(this_00,pBlockEntry);
    if (lVar3 < 0) {
      return lVar3;
    }
    pBVar5 = *pBlockEntry;
    if (*pBlockEntry != (BlockEntry *)0x0) {
      while( true ) {
        iVar2 = (*pBVar5->_vptr_BlockEntry[2])();
        if (CONCAT44(extraout_var,iVar2) == 0) {
          __assert_fail("pBlock",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x124f,"long mkvparser::Track::GetFirst(const BlockEntry *&) const");
        }
        if ((*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) == (this->m_info).number) &&
           (iVar2 = (*this->_vptr_Track[2])(this,*pBlockEntry), (char)iVar2 != '\0')) {
          return 0;
        }
        lVar3 = Cluster::GetNext(this_00,*pBlockEntry,&local_30);
        if (lVar3 < 0) {
          return lVar3;
        }
        if (local_30 == (BlockEntry *)0x0) break;
        *pBlockEntry = local_30;
        pBVar5 = local_30;
      }
      if (0x62 < iVar4) break;
      iVar4 = iVar4 + 1;
    }
    this_00 = Segment::GetNext(this->m_pSegment,this_00);
  } while (this_00 != (Cluster *)0x0);
  *pBlockEntry = &(this->m_eos).super_BlockEntry;
  return 1;
}

Assistant:

long Track::GetFirst(const BlockEntry*& pBlockEntry) const {
  const Cluster* pCluster = m_pSegment->GetFirst();

  for (int i = 0;;) {
    if (pCluster == NULL) {
      pBlockEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pBlockEntry = GetEOS();
        return 1;
      }

      pBlockEntry = 0;
      return E_BUFFER_NOT_FULL;
    }

    long status = pCluster->GetFirst(pBlockEntry);

    if (status < 0)  // error
      return status;

    if (pBlockEntry == 0) {  // empty cluster
      pCluster = m_pSegment->GetNext(pCluster);
      continue;
    }

    for (;;) {
      const Block* const pBlock = pBlockEntry->GetBlock();
      assert(pBlock);

      const long long tn = pBlock->GetTrackNumber();

      if ((tn == m_info.number) && VetEntry(pBlockEntry))
        return 0;

      const BlockEntry* pNextEntry;

      status = pCluster->GetNext(pBlockEntry, pNextEntry);

      if (status < 0)  // error
        return status;

      if (pNextEntry == 0)
        break;

      pBlockEntry = pNextEntry;
    }

    ++i;

    if (i >= 100)
      break;

    pCluster = m_pSegment->GetNext(pCluster);
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number.  We interpret that as an error (which
  // might be too conservative).

  pBlockEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}